

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::RemoveBuiltinCommand(cmState *this,string *name)

{
  __type _Var1;
  string local_38;
  string *local_18;
  string *name_local;
  cmState *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  cmsys::SystemTools::LowerCase(&local_38,name);
  _Var1 = std::operator==(name,&local_38);
  if (!_Var1) {
    __assert_fail("name == cmSystemTools::LowerCase(name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x22c,"void cmState::RemoveBuiltinCommand(const std::string &)");
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>_>
  ::erase(&this->BuiltinCommands,local_18);
  return;
}

Assistant:

void cmState::RemoveBuiltinCommand(std::string const& name)
{
  assert(name == cmSystemTools::LowerCase(name));
  this->BuiltinCommands.erase(name);
}